

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
PeptData::SegmentsMass
          (PeptData *this,char *sequence,size_t sequence_length,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *cleavage_sites)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R8;
  out_of_range e;
  value_type j;
  double segment;
  size_t end;
  value_type start;
  uint i;
  vector<double,_std::allocator<double>_> *segments_mass;
  key_type *in_stack_ffffffffffffff48;
  unordered_map<char,_double,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_double>_>_>
  *in_stack_ffffffffffffff50;
  mapped_type *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *pvVar3;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 local_4c;
  undefined4 local_30;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x153dc6);
  for (local_30 = 0; sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_R8),
      local_30 < sVar1; local_30 = local_30 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_R8,(ulong)local_30);
    local_4c = *pvVar2;
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_R8);
    this_00 = in_RCX;
    pvVar3 = in_RCX;
    if ((ulong)local_30 != sVar1 - 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_R8,(ulong)(local_30 + 1));
      this_00 = (vector<double,_std::allocator<double>_> *)(ulong)*pvVar2;
      pvVar3 = (vector<double,_std::allocator<double>_> *)(ulong)*pvVar2;
    }
    for (; (vector<double,_std::allocator<double>_> *)(ulong)local_4c < pvVar3;
        local_4c = local_4c + 1) {
      in_stack_ffffffffffffff58 =
           std::
           unordered_map<char,_double,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_double>_>_>
           ::at(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

std::vector<double> SegmentsMass(const char* sequence, size_t sequence_length,
                                     const std::vector<unsigned>& cleavage_sites) const {
        std::vector<double> segments_mass;
        for (unsigned i = 0; i < cleavage_sites.size(); ++i) {
            auto start = cleavage_sites[i];
            auto end = i == cleavage_sites.size() - 1
                       ? sequence_length
                       : cleavage_sites[i + 1];
            double segment = 0;
            try {
                for (auto j = start; j < end; ++j) {
                    segment += mass_table_.at(sequence[j]);  // will throw an exception if no such character in table
                }
            }
            catch (std::out_of_range e) {
                segment = 0;  // if there is an error, the segment equals to 0
            }
            segments_mass.push_back(segment);
        }
        return segments_mass;
    }